

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

void NJD_load_from_fp(NJD *njd,FILE *fp)

{
  FILE *node_00;
  int iVar1;
  long in_RSI;
  NJD *in_RDI;
  char chain_flag [1024];
  char chain_rule [1024];
  char mora_size [1024];
  char acc [1024];
  char pron [1024];
  char read [1024];
  char orig [1024];
  char cform [1024];
  char ctype [1024];
  char pos_group3 [1024];
  char pos_group2 [1024];
  char pos_group1 [1024];
  char pos [1024];
  char string [1024];
  NJDNode *node;
  undefined4 in_stack_ffffffffffffc7c8;
  int in_stack_ffffffffffffc7cc;
  FILE *in_stack_ffffffffffffc7d0;
  FILE *in_stack_ffffffffffffc7d8;
  char local_3818 [2048];
  char local_3018 [1024];
  char local_2c18 [11264];
  FILE *local_18;
  NJD *local_8;
  
  local_18 = (FILE *)0x0;
  local_8 = in_RDI;
  if (in_RSI == 0) {
    fprintf(_stderr,"WARNING: NJD_load_from_fp() in njd.c: File pointer should not be null.");
  }
  else {
    while( true ) {
      get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                        (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                                (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      if ((((iVar1 < 1) ||
           (iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                                      (char)((uint)in_stack_ffffffffffffc7cc >> 0x18)), iVar1 < 1))
          || (iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                                        (char)((uint)in_stack_ffffffffffffc7cc >> 0x18)), iVar1 < 1)
          ) || (((iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,
                                            (char *)in_stack_ffffffffffffc7d0,
                                            (char)((uint)in_stack_ffffffffffffc7cc >> 0x18)),
                 iVar1 < 1 ||
                 (iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,
                                            (char *)in_stack_ffffffffffffc7d0,
                                            (char)((uint)in_stack_ffffffffffffc7cc >> 0x18)),
                 iVar1 < 1)) ||
                (iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,
                                           (char *)in_stack_ffffffffffffc7d0,
                                           (char)((uint)in_stack_ffffffffffffc7cc >> 0x18)),
                iVar1 < 1)))) break;
      get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                        (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                        (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                        (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                                (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      if (iVar1 < 1) {
        return;
      }
      iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                                (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      if (iVar1 < 1) {
        return;
      }
      get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                        (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      iVar1 = get_token_from_fp(in_stack_ffffffffffffc7d8,(char *)in_stack_ffffffffffffc7d0,
                                (char)((uint)in_stack_ffffffffffffc7cc >> 0x18));
      if (iVar1 < 1) {
        return;
      }
      local_18 = (FILE *)calloc(1,0x78);
      NJDNode_initialize((NJDNode *)local_18);
      NJDNode_set_string((NJDNode *)in_stack_ffffffffffffc7d0,
                         (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_pos((NJDNode *)in_stack_ffffffffffffc7d0,
                      (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_pos_group1
                ((NJDNode *)in_stack_ffffffffffffc7d0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_pos_group2
                ((NJDNode *)in_stack_ffffffffffffc7d0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_pos_group3
                ((NJDNode *)in_stack_ffffffffffffc7d0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_ctype((NJDNode *)in_stack_ffffffffffffc7d0,
                        (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_cform((NJDNode *)in_stack_ffffffffffffc7d0,
                        (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_orig((NJDNode *)in_stack_ffffffffffffc7d0,
                       (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_read((NJDNode *)in_stack_ffffffffffffc7d0,
                       (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      NJDNode_set_pron((NJDNode *)in_stack_ffffffffffffc7d0,
                       (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      in_stack_ffffffffffffc7d0 = local_18;
      atoi(local_2c18);
      NJDNode_set_acc((NJDNode *)in_stack_ffffffffffffc7d0,in_stack_ffffffffffffc7cc);
      in_stack_ffffffffffffc7d8 = local_18;
      atoi(local_3018);
      NJDNode_set_mora_size((NJDNode *)in_stack_ffffffffffffc7d0,in_stack_ffffffffffffc7cc);
      NJDNode_set_chain_rule
                ((NJDNode *)in_stack_ffffffffffffc7d0,
                 (char *)CONCAT44(in_stack_ffffffffffffc7cc,in_stack_ffffffffffffc7c8));
      node_00 = local_18;
      iVar1 = atoi(local_3818);
      NJDNode_set_chain_flag((NJDNode *)node_00,iVar1);
      NJD_push_node(local_8,(NJDNode *)local_18);
    }
  }
  return;
}

Assistant:

void NJD_load_from_fp(NJD * njd, FILE * fp)
{
   NJDNode *node = NULL;
   char string[MAXBUFLEN];
   char pos[MAXBUFLEN];
   char pos_group1[MAXBUFLEN];
   char pos_group2[MAXBUFLEN];
   char pos_group3[MAXBUFLEN];
   char ctype[MAXBUFLEN];
   char cform[MAXBUFLEN];
   char orig[MAXBUFLEN];
   char read[MAXBUFLEN];
   char pron[MAXBUFLEN];
   char acc[MAXBUFLEN];
   char mora_size[MAXBUFLEN];
   char chain_rule[MAXBUFLEN];
   char chain_flag[MAXBUFLEN];

   if (fp == NULL) {
      fprintf(stderr, "WARNING: NJD_load_from_fp() in njd.c: File pointer should not be null.");
      return;
   }

   while (1) {
      get_token_from_fp(fp, string, ',');
      if (get_token_from_fp(fp, pos, ',') <= 0)
         break;
      if (get_token_from_fp(fp, pos_group1, ',') <= 0)
         break;
      if (get_token_from_fp(fp, pos_group2, ',') <= 0)
         break;
      if (get_token_from_fp(fp, pos_group3, ',') <= 0)
         break;
      if (get_token_from_fp(fp, ctype, ',') <= 0)
         break;
      if (get_token_from_fp(fp, cform, ',') <= 0)
         break;
      get_token_from_fp(fp, orig, ',');
      get_token_from_fp(fp, read, ',');
      get_token_from_fp(fp, pron, ',');
      if (get_token_from_fp(fp, acc, '/') <= 0)
         break;
      if (get_token_from_fp(fp, mora_size, ',') <= 0)
         break;
      get_token_from_fp(fp, chain_rule, ',');
      if (get_token_from_fp(fp, chain_flag, ',') <= 0)
         break;
      node = (NJDNode *) calloc(1, sizeof(NJDNode));
      NJDNode_initialize(node);
      NJDNode_set_string(node, string);
      NJDNode_set_pos(node, pos);
      NJDNode_set_pos_group1(node, pos_group1);
      NJDNode_set_pos_group2(node, pos_group2);
      NJDNode_set_pos_group3(node, pos_group3);
      NJDNode_set_ctype(node, ctype);
      NJDNode_set_cform(node, cform);
      NJDNode_set_orig(node, orig);
      NJDNode_set_read(node, read);
      NJDNode_set_pron(node, pron);
      NJDNode_set_acc(node, atoi(acc));
      NJDNode_set_mora_size(node, atoi(mora_size));
      NJDNode_set_chain_rule(node, chain_rule);
      NJDNode_set_chain_flag(node, atoi(chain_flag));
      NJD_push_node(njd, node);
   }
}